

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_tag.cpp
# Opt level: O2

ScalarFunction * duckdb::UnionTagFun::GetFunction(void)

{
  LogicalType varargs;
  ScalarFunction *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff5c;
  FunctionNullHandling in_stack_ffffffffffffff68;
  allocator_type local_91;
  code *bind_lambda;
  LogicalType local_70;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_58;
  LogicalType local_40;
  LogicalType local_28;
  
  LogicalType::LogicalType(&local_28,UNION);
  __l._M_len = 1;
  __l._M_array = &local_28;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_58,__l,&local_91);
  LogicalType::LogicalType(&local_70,ANY);
  bind_lambda = UnionTagFunction;
  LogicalType::LogicalType(&local_40,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_40;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_ffffffffffffff54;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_ffffffffffffff5c;
  ScalarFunction::ScalarFunction
            (in_RDI,(vector<duckdb::LogicalType,_true> *)&local_58,&local_70,
             (scalar_function_t *)&stack0xffffffffffffff70,UnionTagBind,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,(init_local_state_t)0x0
             ,varargs,CONSISTENT,in_stack_ffffffffffffff68,bind_lambda);
  LogicalType::~LogicalType(&local_40);
  ::std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffff70);
  LogicalType::~LogicalType(&local_70);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_58);
  LogicalType::~LogicalType(&local_28);
  return in_RDI;
}

Assistant:

ScalarFunction UnionTagFun::GetFunction() {
	return ScalarFunction({LogicalTypeId::UNION}, LogicalTypeId::ANY, UnionTagFunction, UnionTagBind, nullptr,
	                      nullptr); // TODO: Statistics?
}